

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O3

void __thiscall absl::flags_internal::FlagImpl::Write(FlagImpl *this,void *src)

{
  FlagOpFn p_Var1;
  DynValueDeleter DVar2;
  Mutex *this_00;
  char *pcVar3;
  void *pvVar4;
  void *pvVar5;
  AlphaNum *in_R9;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  string src_as_str;
  string ignored_error;
  char *local_150;
  FlagOpFn local_148;
  char local_140;
  undefined7 uStack_13f;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  string local_110;
  DynValueDeleter local_f0;
  char *local_e8;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  this_00 = DataGuard(this);
  Mutex::Lock(this_00);
  pcVar3 = (char *)(*this->op_)(kFastTypeId,(void *)0x0,(void *)0x0,(void *)0x0);
  iVar6 = (int)pcVar3;
  iVar7 = (int)((ulong)pcVar3 >> 0x20);
  auVar13._0_4_ = -(uint)(iVar6 == 0x15fdd8);
  auVar13._4_4_ = -(uint)(iVar7 == 0);
  auVar13._8_4_ = -(uint)(iVar6 == 0x15fdd9);
  auVar13._12_4_ = -(uint)(iVar7 == 0);
  auVar15._4_4_ = auVar13._0_4_;
  auVar15._0_4_ = auVar13._4_4_;
  auVar15._8_4_ = auVar13._12_4_;
  auVar15._12_4_ = auVar13._8_4_;
  auVar12._0_4_ = -(uint)(iVar6 == 0x15fdd6);
  auVar12._4_4_ = -(uint)(iVar7 == 0);
  auVar12._8_4_ = -(uint)(iVar6 == 0x15fdd7);
  auVar12._12_4_ = -(uint)(iVar7 == 0);
  auVar14._4_4_ = auVar12._0_4_;
  auVar14._0_4_ = auVar12._4_4_;
  auVar14._8_4_ = auVar12._12_4_;
  auVar14._12_4_ = auVar12._8_4_;
  auVar15 = packssdw(auVar14 & auVar12,auVar15 & auVar13);
  auVar11._0_4_ = -(uint)(iVar6 == 0x15fdd4);
  auVar11._4_4_ = -(uint)(iVar7 == 0);
  auVar11._8_4_ = -(uint)(iVar6 == 0x15fdd5);
  auVar11._12_4_ = -(uint)(iVar7 == 0);
  auVar10._4_4_ = auVar11._0_4_;
  auVar10._0_4_ = auVar11._4_4_;
  auVar10._8_4_ = auVar11._12_4_;
  auVar10._12_4_ = auVar11._8_4_;
  auVar9._0_4_ = -(uint)(iVar6 == 0x15f7af);
  auVar9._4_4_ = -(uint)(iVar7 == 0);
  auVar9._8_4_ = -(uint)(iVar6 == 0x15fdd3);
  auVar9._12_4_ = -(uint)(iVar7 == 0);
  auVar8._4_4_ = auVar9._0_4_;
  auVar8._0_4_ = auVar9._4_4_;
  auVar8._8_4_ = auVar9._12_4_;
  auVar8._12_4_ = auVar9._8_4_;
  auVar9 = packssdw(auVar8 & auVar9,auVar10 & auVar11);
  auVar9 = packssdw(auVar9,auVar15);
  if (((((((((((auVar9 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar9 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar9 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar9 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar9 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar9 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar9 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar9[0xf]) &&
       (pcVar3 != "")) && (pcVar3 != "")) && (((pcVar3 != "" && (pcVar3 != "")) && (pcVar3 != ""))))
  {
    p_Var1 = this->op_;
    pvVar4 = (*p_Var1)(kAlloc,(void *)0x0,(void *)0x0,(void *)0x0);
    (*p_Var1)(kCopyConstruct,src,pvVar4,(void *)0x0);
    DynValueDeleter::DynValueDeleter(&local_f0,this->op_);
    DVar2.op = local_f0.op;
    local_130 = &local_120;
    local_128 = 0;
    local_120 = 0;
    local_148 = (FlagOpFn)0x0;
    local_140 = '\0';
    local_150 = &local_140;
    (*this->op_)(kUnparse,src,&local_150,(void *)0x0);
    local_f0.op = local_148;
    local_e8 = local_150;
    pvVar5 = (*this->op_)(kParse,&local_f0,pvVar4,&local_130);
    if (pvVar5 == (void *)0x0) {
      local_f0.op = (FlagOpFn)0x15;
      local_e8 = "Attempt to set flag \'";
      pcVar3 = this->name_;
      local_60.piece_._M_len = strlen(pcVar3);
      local_90.piece_._M_len = 0x13;
      local_90.piece_._M_str = "\' to invalid value ";
      local_c0.piece_._M_len = (size_t)local_148;
      local_c0.piece_._M_str = local_150;
      local_60.piece_._M_str = pcVar3;
      StrCat_abi_cxx11_(&local_110,(absl *)&local_f0,&local_60,&local_90,&local_c0,in_R9);
      (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                (2,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/flags/internal/flag.cc"
                 ,0x200,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
    }
    if (DVar2.op != (FlagOpFn)0x0 && pvVar4 != (void *)0x0) {
      (*DVar2.op)(kDelete,(void *)0x0,pvVar4,(void *)0x0);
    }
  }
  StoreValue(this,src);
  Mutex::Unlock(this_00);
  return;
}

Assistant:

void FlagImpl::Write(const void* src) {
  absl::MutexLock l(DataGuard());

  if (ShouldValidateFlagValue(flags_internal::FastTypeId(op_))) {
    std::unique_ptr<void, DynValueDeleter> obj{flags_internal::Clone(op_, src),
                                               DynValueDeleter{op_}};
    std::string ignored_error;
    std::string src_as_str = flags_internal::Unparse(op_, src);
    if (!flags_internal::Parse(op_, src_as_str, obj.get(), &ignored_error)) {
      ABSL_INTERNAL_LOG(ERROR, absl::StrCat("Attempt to set flag '", Name(),
                                            "' to invalid value ", src_as_str));
    }
  }

  StoreValue(src);
}